

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::CurlURLInputStream::CurlURLInputStream
          (CurlURLInputStream *this,XMLURL *urlSource,XMLNetHTTPInfo *httpInfo)

{
  XMLByte *pXVar1;
  XMLCh *chars;
  int iVar2;
  CURLM *pCVar3;
  CURL *pCVar4;
  XMLCh *pXVar5;
  uchar *puVar6;
  undefined4 extraout_var;
  char *pcVar7;
  undefined4 extraout_var_00;
  curl_slist *pcVar8;
  XMLSize_t length;
  char *pcVar9;
  long lVar10;
  void *__src;
  undefined8 uStack_c0;
  XMLBuffer userPassBuf;
  char *contentType8;
  TranscodeToStr url;
  
  BinInputStream::BinInputStream(&this->super_BinInputStream);
  (this->super_BinInputStream)._vptr_BinInputStream =
       (_func_int **)&PTR__CurlURLInputStream_004088e0;
  this->fHeadersList = (curl_slist *)0x0;
  this->fMulti = (CURLM *)0x0;
  this->fEasy = (CURL *)0x0;
  this->fMemoryManager = urlSource->fMemoryManager;
  XMLURL::XMLURL(&this->fURLSource,urlSource);
  pXVar1 = this->fBuffer;
  this->fBytesRead = 0;
  this->fBytesToRead = 0;
  this->fTotalBytesRead = 0;
  this->fWritePtr = (XMLByte *)0x0;
  this->fDataAvailable = false;
  this->fBufferHeadPtr = pXVar1;
  this->fBufferTailPtr = pXVar1;
  this->fPayload = (char *)0x0;
  this->fPayloadLen = 0;
  this->fContentType = (XMLCh *)0x0;
  pCVar3 = (CURLM *)curl_multi_init();
  this->fMulti = pCVar3;
  pCVar4 = (CURL *)curl_easy_init();
  this->fEasy = pCVar4;
  pXVar5 = XMLURL::getURLText(&this->fURLSource);
  TranscodeToStr::TranscodeToStr(&url,pXVar5,"ISO8859-1",this->fMemoryManager);
  pCVar4 = this->fEasy;
  puVar6 = ArrayJanitor<unsigned_char>::get(&url.fString);
  curl_easy_setopt(pCVar4,0x2712,puVar6);
  curl_easy_setopt(this->fEasy,0x2711,this);
  curl_easy_setopt(this->fEasy,0x4e2b,staticWriteCallback);
  curl_easy_setopt(this->fEasy,0x34,1);
  curl_easy_setopt(this->fEasy,0x44,6);
  pXVar5 = urlSource->fPassword;
  chars = urlSource->fUser;
  if (pXVar5 != (XMLCh *)0x0 && chars != (XMLCh *)0x0) {
    userPassBuf.fMemoryManager = this->fMemoryManager;
    userPassBuf.fIndex = 0;
    userPassBuf.fCapacity = 0x100;
    userPassBuf.fFullSize = 0;
    userPassBuf.fUsed = false;
    userPassBuf.fFullHandler = (XMLBufferFullHandler *)0x0;
    userPassBuf.fBuffer = (XMLCh *)0x0;
    iVar2 = (*(userPassBuf.fMemoryManager)->_vptr_MemoryManager[3])
                      (userPassBuf.fMemoryManager,0x202);
    userPassBuf.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
    *userPassBuf.fBuffer = L'\0';
    XMLBuffer::append(&userPassBuf,chars);
    XMLBuffer::append(&userPassBuf,L':');
    XMLBuffer::append(&userPassBuf,pXVar5);
    userPassBuf.fBuffer[userPassBuf.fIndex] = L'\0';
    TranscodeToStr::TranscodeToStr
              ((TranscodeToStr *)&contentType8,userPassBuf.fBuffer,"ISO8859-1",this->fMemoryManager)
    ;
    curl_easy_setopt(this->fEasy,0x6b,0xffffffffffffffef);
    pCVar4 = this->fEasy;
    puVar6 = ArrayJanitor<unsigned_char>::get((ArrayJanitor<unsigned_char> *)&contentType8);
    curl_easy_setopt(pCVar4,0x2715,puVar6);
    TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&contentType8);
    XMLBuffer::~XMLBuffer(&userPassBuf);
  }
  if (httpInfo == (XMLNetHTTPInfo *)0x0) goto LAB_00326d01;
  if (*(int *)httpInfo == 1) {
    uStack_c0 = 0x2e;
LAB_00326bdf:
    curl_easy_setopt(this->fEasy,uStack_c0,1);
  }
  else if (*(int *)httpInfo == 2) {
    uStack_c0 = 0x2f;
    goto LAB_00326bdf;
  }
  __src = *(void **)(httpInfo + 8);
  if (__src != (void *)0x0) {
    pcVar9 = (char *)(*(long *)(httpInfo + 0x10) + (long)__src);
    do {
      lVar10 = 1;
      while( true ) {
        pcVar7 = (char *)((long)__src + lVar10 + -1);
        if (pcVar9 <= pcVar7) {
          curl_easy_setopt(this->fEasy,0x2727,this->fHeadersList);
          goto LAB_00326ca5;
        }
        if (((*pcVar7 == '\r') && ((char *)(lVar10 + (long)__src) < pcVar9)) &&
           (*(char *)(lVar10 + (long)__src) == '\n')) break;
        lVar10 = lVar10 + 1;
      }
      iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar10);
      userPassBuf.fIndex = CONCAT44(extraout_var_00,iVar2);
      userPassBuf.fCapacity = (XMLSize_t)this->fMemoryManager;
      memcpy((void *)userPassBuf.fIndex,__src,lVar10 - 1);
      *(undefined1 *)((userPassBuf.fIndex - 1) + lVar10) = 0;
      pcVar8 = (curl_slist *)curl_slist_append(this->fHeadersList,userPassBuf.fIndex);
      this->fHeadersList = pcVar8;
      __src = (void *)((long)__src + lVar10 + 1);
      ArrayJanitor<char>::~ArrayJanitor((ArrayJanitor<char> *)&userPassBuf);
    } while( true );
  }
LAB_00326ca5:
  if (*(char **)(httpInfo + 0x18) != (char *)0x0) {
    this->fPayload = *(char **)(httpInfo + 0x18);
    this->fPayloadLen = *(XMLSize_t *)(httpInfo + 0x20);
    curl_easy_setopt(this->fEasy,0x2719,this);
    curl_easy_setopt(this->fEasy,0x4e2c,staticReadCallback);
    curl_easy_setopt(this->fEasy,0x75a3,this->fPayloadLen);
  }
LAB_00326d01:
  curl_multi_add_handle(this->fMulti,this->fEasy);
  if (this->fBufferHeadPtr == pXVar1) {
    do {
      userPassBuf.fIndex = userPassBuf.fIndex & 0xffffffff00000000;
      readMore(this,(int *)&userPassBuf);
      if ((int)userPassBuf.fIndex == 0) break;
    } while (this->fBufferHeadPtr == pXVar1);
  }
  contentType8 = (char *)0x0;
  curl_easy_getinfo(this->fEasy,0x100012);
  pcVar9 = contentType8;
  if (contentType8 != (char *)0x0) {
    length = XMLString::stringLen(contentType8);
    TranscodeFromStr::TranscodeFromStr
              ((TranscodeFromStr *)&userPassBuf,(XMLByte *)pcVar9,length,"ISO8859-1",
               this->fMemoryManager);
    pXVar5 = TranscodeFromStr::adopt((TranscodeFromStr *)&userPassBuf);
    this->fContentType = pXVar5;
    TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)&userPassBuf);
  }
  TranscodeToStr::~TranscodeToStr(&url);
  return;
}

Assistant:

CurlURLInputStream::CurlURLInputStream(const XMLURL& urlSource, const XMLNetHTTPInfo* httpInfo/*=0*/)
      : fMulti(0)
      , fEasy(0)
      , fHeadersList(0)
      , fMemoryManager(urlSource.getMemoryManager())
      , fURLSource(urlSource)
      , fTotalBytesRead(0)
      , fWritePtr(0)
      , fBytesRead(0)
      , fBytesToRead(0)
      , fDataAvailable(false)
      , fBufferHeadPtr(fBuffer)
      , fBufferTailPtr(fBuffer)
      , fPayload(0)
      , fPayloadLen(0)
      , fContentType(0)
{
    // Allocate the curl multi handle
    fMulti = curl_multi_init();

    // Allocate the curl easy handle
    fEasy = curl_easy_init();

    // Set URL option
    TranscodeToStr url(fURLSource.getURLText(), "ISO8859-1", fMemoryManager);
    curl_easy_setopt(fEasy, CURLOPT_URL, (char*)url.str());

    // Set up a way to recieve the data
    curl_easy_setopt(fEasy, CURLOPT_WRITEDATA, this);						// Pass this pointer to write function
    curl_easy_setopt(fEasy, CURLOPT_WRITEFUNCTION, staticWriteCallback);	// Our static write function

    // Do redirects
    curl_easy_setopt(fEasy, CURLOPT_FOLLOWLOCATION, (long)1);
    curl_easy_setopt(fEasy, CURLOPT_MAXREDIRS, (long)6);

    // Add username and password if authentication is required
    const XMLCh *username = urlSource.getUser();
    const XMLCh *password = urlSource.getPassword();
    if(username && password) {
        XMLBuffer userPassBuf(256, fMemoryManager);
        userPassBuf.append(username);
        userPassBuf.append(chColon);
        userPassBuf.append(password);

        TranscodeToStr userPass(userPassBuf.getRawBuffer(), "ISO8859-1", fMemoryManager);

        curl_easy_setopt(fEasy, CURLOPT_HTTPAUTH, (long)CURLAUTH_ANY);
        curl_easy_setopt(fEasy, CURLOPT_USERPWD, (char*)userPass.str());
    }

    if(httpInfo) {
        // Set the correct HTTP method
        switch(httpInfo->fHTTPMethod) {
        case XMLNetHTTPInfo::GET:
            break;
        case XMLNetHTTPInfo::PUT:
            curl_easy_setopt(fEasy, CURLOPT_UPLOAD, (long)1);
            break;
        case XMLNetHTTPInfo::POST:
            curl_easy_setopt(fEasy, CURLOPT_POST, (long)1);
            break;
        }

        // Add custom headers
        if(httpInfo->fHeaders) {
            const char *headersBuf = httpInfo->fHeaders;
            const char *headersBufEnd = httpInfo->fHeaders + httpInfo->fHeadersLen;

            const char *headerStart = headersBuf;
            while(headersBuf < headersBufEnd) {
                if(*headersBuf == '\r' && (headersBuf + 1) < headersBufEnd &&
                   *(headersBuf + 1) == '\n') {

                    XMLSize_t length = headersBuf - headerStart;
                    ArrayJanitor<char> header((char*)fMemoryManager->allocate((length + 1) * sizeof(char)),
                                              fMemoryManager);
                    memcpy(header.get(), headerStart, length);
                    header.get()[length] = 0;

                    fHeadersList = curl_slist_append(fHeadersList, header.get());

                    headersBuf += 2;
                    headerStart = headersBuf;
                    continue;
                }
                ++headersBuf;
            }
            curl_easy_setopt(fEasy, CURLOPT_HTTPHEADER, fHeadersList);
        }

        // Set up the payload
        if(httpInfo->fPayload) {
            fPayload = httpInfo->fPayload;
            fPayloadLen = httpInfo->fPayloadLen;
            curl_easy_setopt(fEasy, CURLOPT_READDATA, this);
            curl_easy_setopt(fEasy, CURLOPT_READFUNCTION, staticReadCallback);
            curl_easy_setopt(fEasy, CURLOPT_INFILESIZE_LARGE, (curl_off_t)fPayloadLen);
        }
    }

    // Add easy handle to the multi stack
    curl_multi_add_handle(fMulti, fEasy);

    // Start reading, to get the content type
    while(fBufferHeadPtr == fBuffer)
    {
    	int runningHandles = 0;
        try
        {
            readMore(&runningHandles);
        }
        catch(const MalformedURLException&)
        {
            cleanup();
            throw;
        }
        catch(const NetAccessorException&)
        {
            cleanup();
            throw;
        }
    	if(runningHandles == 0) break;
    }

    // Find the content type
    char *contentType8 = 0;
    curl_easy_getinfo(fEasy, CURLINFO_CONTENT_TYPE, &contentType8);
    if(contentType8)
        fContentType = TranscodeFromStr((XMLByte*)contentType8, XMLString::stringLen(contentType8), "ISO8859-1", fMemoryManager).adopt();
}